

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplace_back<slang::ast::DefinitionSymbol::ParameterDecl_const&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,ParameterDecl *args)

{
  size_t *psVar1;
  SourceLocation *pSVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_type sVar5;
  ulong uVar6;
  anon_union_8_3_62382250_for_ParameterDecl_0 *p;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar7;
  anon_union_8_3_4d6ead1c_for_ParameterDecl_2 aVar8;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar9;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar10;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar11;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar12;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar13;
  size_t sVar14;
  char *pcVar15;
  SourceLocation SVar16;
  SourceLocation SVar17;
  size_t sVar18;
  anon_union_8_3_62382250_for_ParameterDecl_0 aVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar27;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar28;
  anon_union_8_3_62382250_for_ParameterDecl_0 *paVar29;
  long lVar30;
  long lVar31;
  anon_union_8_3_62382250_for_ParameterDecl_0 *__src;
  ulong uVar32;
  long lVar33;
  
  __src = &this->data_[this->len].field_0;
  if (this->len != this->cap) {
    aVar7 = args->field_0;
    aVar8 = args->field_1;
    aVar9 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->name)._M_len;
    aVar10 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->name)._M_str;
    aVar11 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&args->location;
    aVar12 = (anon_union_8_3_62382250_for_ParameterDecl_0)(args->attributes)._M_ptr;
    aVar13 = *(anon_union_8_3_62382250_for_ParameterDecl_0 *)&args->isTypeParam;
    __src[6] = (anon_union_8_3_62382250_for_ParameterDecl_0)
               (args->attributes)._M_extent._M_extent_value;
    __src[7] = aVar13;
    __src[4] = aVar11;
    __src[5] = aVar12;
    __src[2] = aVar9;
    __src[3] = aVar10;
    *__src = aVar7;
    *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)(__src + 1) = aVar8;
    sVar5 = this->len;
    this->len = sVar5 + 1;
    return this->data_ + sVar5;
  }
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar32 = this->len + 1;
  uVar6 = this->cap;
  if (uVar32 < uVar6 * 2) {
    uVar32 = uVar6 * 2;
  }
  if (0x1ffffffffffffff - uVar6 < uVar6) {
    uVar32 = 0x1ffffffffffffff;
  }
  lVar33 = (long)__src - (long)this->data_;
  paVar29 = (anon_union_8_3_62382250_for_ParameterDecl_0 *)operator_new(uVar32 << 6);
  aVar7 = args->field_0;
  aVar8 = args->field_1;
  sVar14 = (args->name)._M_len;
  pcVar15 = (args->name)._M_str;
  SVar16 = args->location;
  SVar17 = (SourceLocation)(args->attributes)._M_ptr;
  sVar18 = *(size_t *)&args->isTypeParam;
  psVar1 = (size_t *)((long)paVar29 + lVar33 + 0x30);
  *psVar1 = (args->attributes)._M_extent._M_extent_value;
  psVar1[1] = sVar18;
  pSVar2 = (SourceLocation *)((long)paVar29 + lVar33 + 0x20);
  *pSVar2 = SVar16;
  pSVar2[1] = SVar17;
  psVar1 = (size_t *)((long)paVar29 + lVar33 + 0x10);
  *psVar1 = sVar14;
  psVar1[1] = (size_t)pcVar15;
  *(anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar29 + lVar33) = aVar7;
  *(anon_union_8_3_4d6ead1c_for_ParameterDecl_2 *)
   ((anon_union_8_3_62382250_for_ParameterDecl_0 *)((long)paVar29 + lVar33) + 1) = aVar8;
  p = &this->data_->field_0;
  lVar30 = this->len * 0x40;
  lVar31 = (long)p + (lVar30 - (long)__src);
  paVar27 = p;
  paVar28 = paVar29;
  if (lVar31 == 0) {
    if (this->len != 0) {
      lVar31 = 0;
      do {
        uVar20 = *(undefined8 *)((long)p + lVar31);
        uVar21 = ((undefined8 *)((long)p + lVar31))[1];
        puVar3 = (undefined8 *)((long)p + lVar31 + 0x10);
        uVar22 = *puVar3;
        uVar23 = puVar3[1];
        puVar3 = (undefined8 *)((long)p + lVar31 + 0x20);
        uVar24 = *puVar3;
        uVar25 = puVar3[1];
        puVar3 = (undefined8 *)((long)p + lVar31 + 0x30);
        uVar26 = puVar3[1];
        puVar4 = (undefined8 *)((long)paVar29 + lVar31 + 0x30);
        *puVar4 = *puVar3;
        puVar4[1] = uVar26;
        puVar3 = (undefined8 *)((long)paVar29 + lVar31 + 0x20);
        *puVar3 = uVar24;
        puVar3[1] = uVar25;
        puVar3 = (undefined8 *)((long)paVar29 + lVar31 + 0x10);
        *puVar3 = uVar22;
        puVar3[1] = uVar23;
        *(undefined8 *)((long)paVar29 + lVar31) = uVar20;
        ((undefined8 *)((long)paVar29 + lVar31))[1] = uVar21;
        lVar31 = lVar31 + 0x40;
      } while (lVar30 != lVar31);
    }
  }
  else {
    for (; paVar27 != __src; paVar27 = paVar27 + 8) {
      aVar7 = *paVar27;
      aVar9 = paVar27[1];
      aVar10 = paVar27[2];
      aVar11 = paVar27[3];
      aVar12 = paVar27[4];
      aVar13 = paVar27[5];
      aVar19 = paVar27[7];
      paVar28[6] = paVar27[6];
      paVar28[7] = aVar19;
      paVar28[4] = aVar12;
      paVar28[5] = aVar13;
      paVar28[2] = aVar10;
      paVar28[3] = aVar11;
      *paVar28 = aVar7;
      paVar28[1] = aVar9;
      paVar28 = paVar28 + 8;
    }
    memcpy((void *)((long)paVar29 + lVar33 + 0x40),__src,
           (lVar31 - 0x40U & 0xffffffffffffffc0) + 0x40);
  }
  if (p != (anon_union_8_3_62382250_for_ParameterDecl_0 *)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar32;
  this->data_ = (pointer)paVar29;
  return (reference)((long)paVar29 + lVar33);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }